

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void rw::flipBlock(uint8 *dst,uint8 *src)

{
  *dst = *src;
  dst[1] = src[1];
  dst[2] = src[2];
  dst[3] = src[3];
  dst[4] = src[7];
  dst[5] = src[6];
  dst[6] = src[5];
  dst[7] = src[4];
  return;
}

Assistant:

static void
flipBlock(uint8 *dst, uint8 *src)
{
	// color
	dst[0] = src[0];
	dst[1] = src[1];
	dst[2] = src[2];
	dst[3] = src[3];
	// bits
	dst[4] = src[7];
	dst[5] = src[6];
	dst[6] = src[5];
	dst[7] = src[4];
}